

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::sse2::OrientedDiscMiIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  undefined4 uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  int iVar20;
  undefined4 uVar21;
  ulong uVar22;
  RTCFilterFunctionN p_Var23;
  RayHitK<4> *pRVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  float fVar66;
  float fVar69;
  float fVar70;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar71;
  Scene *scene;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  uint local_1c8 [4];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  RayQueryContext *local_1a8;
  float fStack_1a0;
  float fStack_19c;
  undefined4 local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  RTCFilterFunctionNArguments local_188;
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  float local_118 [4];
  float local_108 [4];
  undefined8 local_f8 [2];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  uint local_d8 [4];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar8 = context->scene;
  local_d8[0] = Disc->sharedGeomID;
  uVar22 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar9 = (pSVar8->geometries).items[local_d8[0]].ptr;
  lVar25 = *(long *)&pGVar9->field_0x58;
  _Var10 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(lVar25 + _Var10 * uVar22);
  fVar56 = pfVar1[2];
  uVar26 = (ulong)(Disc->primIDs).field_0.i[1];
  pfVar2 = (float *)(lVar25 + _Var10 * uVar26);
  fStack_194 = *pfVar2;
  fVar57 = pfVar2[2];
  fStack_e0 = pfVar2[3];
  uVar27 = (ulong)(Disc->primIDs).field_0.i[2];
  pfVar3 = (float *)(lVar25 + _Var10 * uVar27);
  uVar28 = (ulong)(Disc->primIDs).field_0.i[3];
  pfVar4 = (float *)(lVar25 + _Var10 * uVar28);
  fStack_dc = pfVar4[3];
  local_1a8 = (RayQueryContext *)CONCAT44(fVar57,fVar56);
  lVar25 = *(long *)&pGVar9[1].time_range.upper;
  p_Var23 = pGVar9[1].intersectionFilterN;
  pfVar5 = (float *)(lVar25 + uVar22 * (long)p_Var23);
  local_118[0] = *pfVar5;
  local_108[0] = pfVar5[1];
  fVar18 = pfVar5[2];
  pfVar5 = (float *)(lVar25 + uVar26 * (long)p_Var23);
  local_118[1] = *pfVar5;
  local_108[1] = pfVar5[1];
  fVar19 = pfVar5[2];
  pfVar5 = (float *)(lVar25 + uVar27 * (long)p_Var23);
  local_118[2] = *pfVar5;
  local_108[2] = pfVar5[1];
  local_e8 = pfVar5[2];
  pfVar5 = (float *)(lVar25 + (long)p_Var23 * uVar28);
  local_118[3] = *pfVar5;
  local_108[3] = pfVar5[1];
  fStack_e4 = pfVar5[2];
  local_d8[1] = local_d8[0];
  local_d8[2] = local_d8[0];
  local_d8[3] = local_d8[0];
  fVar55 = *(float *)(ray + k * 4 + 0x10);
  fVar59 = *(float *)(ray + k * 4 + 0x20);
  fVar52 = *(float *)(ray + k * 4 + 0x40);
  fVar58 = *(float *)(ray + k * 4 + 0x50);
  fVar6 = *(float *)(ray + k * 4 + 0x60);
  fVar60 = local_118[0] * fVar52 + local_108[0] * fVar58 + fVar18 * fVar6;
  fVar62 = local_118[1] * fVar52 + local_108[1] * fVar58 + fVar19 * fVar6;
  fVar63 = local_118[2] * fVar52 + local_108[2] * fVar58 + local_e8 * fVar6;
  fVar64 = local_118[3] * fVar52 + local_108[3] * fVar58 + fStack_e4 * fVar6;
  uVar30 = -(uint)(fVar60 != 0.0);
  uVar31 = -(uint)(fVar62 != 0.0);
  uVar32 = -(uint)(fVar63 != 0.0);
  uVar33 = -(uint)(fVar64 != 0.0);
  auVar65._0_8_ = CONCAT44(~uVar31,~uVar30) & 0x3f8000003f800000;
  auVar65._8_4_ = ~uVar32 & 0x3f800000;
  auVar65._12_4_ = ~uVar33 & 0x3f800000;
  auVar68._4_4_ = (uint)fVar62 & uVar31;
  auVar68._0_4_ = (uint)fVar60 & uVar30;
  auVar68._8_4_ = (uint)fVar63 & uVar32;
  auVar68._12_4_ = (uint)fVar64 & uVar33;
  fVar53 = *(float *)(ray + k * 4);
  auVar67._0_4_ =
       (*pfVar1 - fVar53) * local_118[0] +
       (pfVar1[1] - fVar55) * local_108[0] + (fVar56 - fVar59) * fVar18;
  auVar67._4_4_ =
       (fStack_194 - fVar53) * local_118[1] +
       (pfVar2[1] - fVar55) * local_108[1] + (fVar57 - fVar59) * fVar19;
  auVar67._8_4_ =
       (*pfVar3 - fVar53) * local_118[2] +
       (pfVar3[1] - fVar55) * local_108[2] + (pfVar3[2] - fVar59) * local_e8;
  auVar67._12_4_ =
       (*pfVar4 - fVar53) * local_118[3] +
       (pfVar4[1] - fVar55) * local_108[3] + (pfVar4[2] - fVar59) * fStack_e4;
  auVar68 = divps(auVar67,auVar65 | auVar68);
  fVar54 = *(float *)(ray + k * 4 + 0x80);
  fVar66 = auVar68._0_4_;
  fVar69 = auVar68._4_4_;
  fVar70 = auVar68._8_4_;
  fVar71 = auVar68._12_4_;
  fVar61 = *(float *)(ray + k * 4 + 0x30);
  uVar30 = (uint)Disc->numPrimitives;
  bVar16 = (uVar30 != 0 && fVar60 != 0.0) && (fVar61 <= fVar66 && fVar66 <= fVar54);
  auVar47._0_4_ = -(uint)bVar16;
  bVar17 = (1 < uVar30 && fVar62 != 0.0) && (fVar61 <= fVar69 && fVar69 <= fVar54);
  auVar47._4_4_ = -(uint)bVar17;
  bVar15 = (2 < uVar30 && fVar63 != 0.0) && (fVar70 <= fVar54 && fVar61 <= fVar70);
  auVar47._8_4_ = -(uint)bVar15;
  bVar14 = (3 < uVar30 && fVar64 != 0.0) && (fVar71 <= fVar54 && fVar61 <= fVar71);
  auVar47._12_4_ = -(uint)bVar14;
  iVar20 = movmskps(uVar30,auVar47);
  if (iVar20 != 0) {
    fVar61 = (fVar53 + fVar52 * fVar66) - *pfVar1;
    fVar60 = (fVar53 + fVar52 * fVar69) - fStack_194;
    fVar62 = (fVar53 + fVar52 * fVar70) - fStack_190;
    fVar63 = (fVar53 + fVar52 * fVar71) - fStack_18c;
    fVar52 = (fVar55 + fVar58 * fVar66) - pfVar1[1];
    fVar53 = (fVar55 + fVar58 * fVar69) - pfVar2[1];
    fVar54 = (fVar55 + fVar58 * fVar70) - pfVar3[1];
    fVar55 = (fVar55 + fVar58 * fVar71) - pfVar4[1];
    fVar56 = (fVar59 + fVar6 * fVar66) - fVar56;
    fVar57 = (fVar59 + fVar6 * fVar69) - fVar57;
    fVar58 = (fVar59 + fVar6 * fVar70) - fStack_1a0;
    fVar59 = (fVar59 + fVar6 * fVar71) - fStack_19c;
    bVar16 = fVar61 * fVar61 + fVar52 * fVar52 + fVar56 * fVar56 < pfVar1[3] * pfVar1[3] && bVar16;
    local_1c8[0] = -(uint)bVar16;
    bVar17 = fVar60 * fVar60 + fVar53 * fVar53 + fVar57 * fVar57 < fStack_e0 * fStack_e0 && bVar17;
    local_1c8[1] = -(uint)bVar17;
    bVar15 = fVar62 * fVar62 + fVar54 * fVar54 + fVar58 * fVar58 < pfVar3[3] * pfVar3[3] && bVar15;
    local_1c8[2] = -(uint)bVar15;
    bVar14 = fVar63 * fVar63 + fVar55 * fVar55 + fVar59 * fVar59 < fStack_dc * fStack_dc && bVar14;
    local_1c8[3] = -(uint)bVar14;
    auVar12._4_4_ = local_1c8[1];
    auVar12._0_4_ = local_1c8[0];
    auVar12._8_4_ = local_1c8[2];
    auVar12._12_4_ = local_1c8[3];
    iVar20 = movmskps(iVar20,auVar12);
    if (iVar20 != 0) {
      local_138 = 0;
      uStack_130 = 0;
      local_148 = 0;
      uStack_140 = 0;
      local_128 = auVar68;
      local_f8[0] = CONCAT44(fVar19,fVar18);
      auVar34._0_4_ = (uint)fVar66 & local_1c8[0];
      auVar34._4_4_ = (uint)fVar69 & local_1c8[1];
      auVar34._8_4_ = (uint)fVar70 & local_1c8[2];
      auVar34._12_4_ = (uint)fVar71 & local_1c8[3];
      auVar41._0_8_ = CONCAT44(~local_1c8[1],~local_1c8[0]) & 0x7f8000007f800000;
      auVar41._8_4_ = ~local_1c8[2] & 0x7f800000;
      auVar41._12_4_ = ~local_1c8[3] & 0x7f800000;
      auVar41 = auVar41 | auVar34;
      auVar46._4_4_ = auVar41._0_4_;
      auVar46._0_4_ = auVar41._4_4_;
      auVar46._8_4_ = auVar41._12_4_;
      auVar46._12_4_ = auVar41._8_4_;
      auVar47 = minps(auVar46,auVar41);
      auVar35._0_8_ = auVar47._8_8_;
      auVar35._8_4_ = auVar47._0_4_;
      auVar35._12_4_ = auVar47._4_4_;
      auVar47 = minps(auVar35,auVar47);
      auVar36._0_4_ = -(uint)(auVar47._0_4_ == auVar41._0_4_ && bVar16);
      auVar36._4_4_ = -(uint)(auVar47._4_4_ == auVar41._4_4_ && bVar17);
      auVar36._8_4_ = -(uint)(auVar47._8_4_ == auVar41._8_4_ && bVar15);
      auVar36._12_4_ = -(uint)(auVar47._12_4_ == auVar41._12_4_ && bVar14);
      iVar20 = movmskps(iVar20,auVar36);
      uVar30 = local_1c8[0];
      uVar31 = local_1c8[1];
      uVar32 = local_1c8[2];
      uVar33 = local_1c8[3];
      if (iVar20 != 0) {
        uVar30 = auVar36._0_4_;
        uVar31 = auVar36._4_4_;
        uVar32 = auVar36._8_4_;
        uVar33 = auVar36._12_4_;
      }
      auVar13._4_4_ = uVar31;
      auVar13._0_4_ = uVar30;
      auVar13._8_4_ = uVar32;
      auVar13._12_4_ = uVar33;
      uVar30 = movmskps(iVar20,auVar13);
      lVar25 = 0;
      if (uVar30 != 0) {
        for (; (uVar30 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
        }
      }
      lVar29 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      do {
        local_188.hit = (RTCHitN *)&local_c8;
        local_188.valid = (int *)&local_1b8;
        local_68 = local_d8[lVar25];
        uVar22 = (ulong)local_68;
        pGVar9 = (pSVar8->geometries).items[uVar22].ptr;
        if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          local_1c8[lVar25] = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar21 = *(undefined4 *)((long)&local_148 + lVar25 * 4);
            uVar7 = *(undefined4 *)((long)&local_138 + lVar25 * 4);
            *(float *)(ray + k * 4 + 0x80) = local_118[lVar25 + -4];
            *(float *)(ray + k * 4 + 0xc0) = local_118[lVar25];
            *(float *)(ray + k * 4 + 0xd0) = local_108[lVar25];
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_f8 + lVar25 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar21;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
            *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[lVar25];
            *(uint *)(ray + k * 4 + 0x120) = local_68;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            return;
          }
          local_98 = *(undefined4 *)((long)&local_148 + lVar25 * 4);
          local_88 = *(undefined4 *)((long)&local_138 + lVar25 * 4);
          local_c8 = local_118[lVar25];
          local_b8 = local_108[lVar25];
          local_78 = (Disc->primIDs).field_0.i[lVar25];
          uVar21 = *(undefined4 *)((long)local_f8 + lVar25 * 4);
          local_a8._4_4_ = uVar21;
          local_a8._0_4_ = uVar21;
          local_a8._8_4_ = uVar21;
          local_a8._12_4_ = uVar21;
          fStack_c4 = local_c8;
          fStack_c0 = local_c8;
          fStack_bc = local_c8;
          fStack_b4 = local_b8;
          fStack_b0 = local_b8;
          fStack_ac = local_b8;
          uStack_94 = local_98;
          uStack_90 = local_98;
          uStack_8c = local_98;
          uStack_84 = local_88;
          uStack_80 = local_88;
          uStack_7c = local_88;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          local_58 = context->user->instID[0];
          uStack_54 = local_58;
          uStack_50 = local_58;
          uStack_4c = local_58;
          local_48 = context->user->instPrimID[0];
          uStack_44 = local_48;
          uStack_40 = local_48;
          uStack_3c = local_48;
          local_198 = *(undefined4 *)(ray + k * 4 + 0x80);
          *(float *)(ray + k * 4 + 0x80) = local_118[lVar25 + -4];
          local_1b8 = *(undefined8 *)(mm_lookupmask_ps + lVar29);
          uStack_1b0 = *(undefined8 *)(mm_lookupmask_ps + lVar29 + 8);
          local_188.geometryUserPtr = pGVar9->userPtr;
          local_188.context = context->user;
          local_188.N = 4;
          p_Var23 = pGVar9->intersectionFilterN;
          local_188.ray = (RTCRayN *)ray;
          local_158 = auVar68;
          if (p_Var23 != (RTCFilterFunctionN)0x0) {
            local_1a8 = context;
            p_Var23 = (RTCFilterFunctionN)(*p_Var23)(&local_188);
            context = local_1a8;
          }
          auVar37._0_4_ = -(uint)((int)local_1b8 == 0);
          auVar37._4_4_ = -(uint)(local_1b8._4_4_ == 0);
          auVar37._8_4_ = -(uint)((int)uStack_1b0 == 0);
          auVar37._12_4_ = -(uint)(uStack_1b0._4_4_ == 0);
          uVar30 = movmskps((int)p_Var23,auVar37);
          pRVar24 = (RayHitK<4> *)(ulong)(uVar30 ^ 0xf);
          if ((uVar30 ^ 0xf) == 0) {
            auVar11._8_4_ = 0xffffffff;
            auVar11._0_8_ = 0xffffffffffffffff;
            auVar11._12_4_ = 0xffffffff;
            auVar38 = auVar37 ^ auVar11;
            auVar68 = local_158;
          }
          else {
            p_Var23 = context->args->filter;
            if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
              p_Var23 = (RTCFilterFunctionN)(*p_Var23)(&local_188);
            }
            auVar42._0_4_ = -(uint)((int)local_1b8 == 0);
            auVar42._4_4_ = -(uint)(local_1b8._4_4_ == 0);
            auVar42._8_4_ = -(uint)((int)uStack_1b0 == 0);
            auVar42._12_4_ = -(uint)(uStack_1b0._4_4_ == 0);
            auVar38._8_4_ = 0xffffffff;
            auVar38._0_8_ = 0xffffffffffffffff;
            auVar38._12_4_ = 0xffffffff;
            auVar38 = auVar42 ^ auVar38;
            uVar30 = movmskps((int)p_Var23,auVar42);
            pRVar24 = (RayHitK<4> *)(ulong)(uVar30 ^ 0xf);
            auVar68 = local_158;
            if ((uVar30 ^ 0xf) != 0) {
              auVar48._0_4_ = *(uint *)(local_188.ray + 0xc0) & auVar42._0_4_;
              auVar48._4_4_ = *(uint *)(local_188.ray + 0xc4) & auVar42._4_4_;
              auVar48._8_4_ = *(uint *)(local_188.ray + 200) & auVar42._8_4_;
              auVar48._12_4_ = *(uint *)(local_188.ray + 0xcc) & auVar42._12_4_;
              auVar51._0_4_ = ~auVar42._0_4_ & (uint)*(float *)local_188.hit;
              auVar51._4_4_ = ~auVar42._4_4_ & (uint)*(float *)(local_188.hit + 4);
              auVar51._8_4_ = ~auVar42._8_4_ & (uint)*(float *)(local_188.hit + 8);
              auVar51._12_4_ = ~auVar42._12_4_ & (uint)*(float *)(local_188.hit + 0xc);
              *(undefined1 (*) [16])(local_188.ray + 0xc0) = auVar51 | auVar48;
              fVar55 = *(float *)(local_188.hit + 0x14);
              fVar59 = *(float *)(local_188.hit + 0x18);
              fVar52 = *(float *)(local_188.hit + 0x1c);
              *(uint *)(local_188.ray + 0xd0) =
                   ~auVar42._0_4_ & (uint)*(float *)(local_188.hit + 0x10) |
                   *(uint *)(local_188.ray + 0xd0) & auVar42._0_4_;
              *(uint *)(local_188.ray + 0xd4) =
                   ~auVar42._4_4_ & (uint)fVar55 | *(uint *)(local_188.ray + 0xd4) & auVar42._4_4_;
              *(uint *)(local_188.ray + 0xd8) =
                   ~auVar42._8_4_ & (uint)fVar59 | *(uint *)(local_188.ray + 0xd8) & auVar42._8_4_;
              *(uint *)(local_188.ray + 0xdc) =
                   ~auVar42._12_4_ & (uint)fVar52 | *(uint *)(local_188.ray + 0xdc) & auVar42._12_4_
              ;
              *(undefined1 (*) [16])(local_188.ray + 0xe0) =
                   ~auVar42 & *(undefined1 (*) [16])(local_188.hit + 0x20) |
                   *(undefined1 (*) [16])(local_188.ray + 0xe0) & auVar42;
              *(undefined1 (*) [16])(local_188.ray + 0xf0) =
                   ~auVar42 & *(undefined1 (*) [16])(local_188.hit + 0x30) |
                   *(undefined1 (*) [16])(local_188.ray + 0xf0) & auVar42;
              fVar55 = *(float *)(local_188.hit + 0x44);
              fVar59 = *(float *)(local_188.hit + 0x48);
              fVar52 = *(float *)(local_188.hit + 0x4c);
              *(uint *)(local_188.ray + 0x100) =
                   ~auVar42._0_4_ & (uint)*(float *)(local_188.hit + 0x40) |
                   *(uint *)(local_188.ray + 0x100) & auVar42._0_4_;
              *(uint *)(local_188.ray + 0x104) =
                   ~auVar42._4_4_ & (uint)fVar55 | *(uint *)(local_188.ray + 0x104) & auVar42._4_4_;
              *(uint *)(local_188.ray + 0x108) =
                   ~auVar42._8_4_ & (uint)fVar59 | *(uint *)(local_188.ray + 0x108) & auVar42._8_4_;
              *(uint *)(local_188.ray + 0x10c) =
                   ~auVar42._12_4_ & (uint)fVar52 |
                   *(uint *)(local_188.ray + 0x10c) & auVar42._12_4_;
              fVar55 = *(float *)(local_188.hit + 0x54);
              fVar59 = *(float *)(local_188.hit + 0x58);
              fVar52 = *(float *)(local_188.hit + 0x5c);
              *(uint *)(local_188.ray + 0x110) =
                   *(uint *)(local_188.ray + 0x110) & auVar42._0_4_ |
                   ~auVar42._0_4_ & (uint)*(float *)(local_188.hit + 0x50);
              *(uint *)(local_188.ray + 0x114) =
                   *(uint *)(local_188.ray + 0x114) & auVar42._4_4_ | ~auVar42._4_4_ & (uint)fVar55;
              *(uint *)(local_188.ray + 0x118) =
                   *(uint *)(local_188.ray + 0x118) & auVar42._8_4_ | ~auVar42._8_4_ & (uint)fVar59;
              *(uint *)(local_188.ray + 0x11c) =
                   *(uint *)(local_188.ray + 0x11c) & auVar42._12_4_ |
                   ~auVar42._12_4_ & (uint)fVar52;
              fVar55 = *(float *)(local_188.hit + 100);
              fVar59 = *(float *)(local_188.hit + 0x68);
              fVar52 = *(float *)(local_188.hit + 0x6c);
              *(uint *)(local_188.ray + 0x120) =
                   *(uint *)(local_188.ray + 0x120) & auVar42._0_4_ |
                   ~auVar42._0_4_ & (uint)*(float *)(local_188.hit + 0x60);
              *(uint *)(local_188.ray + 0x124) =
                   *(uint *)(local_188.ray + 0x124) & auVar42._4_4_ | ~auVar42._4_4_ & (uint)fVar55;
              *(uint *)(local_188.ray + 0x128) =
                   *(uint *)(local_188.ray + 0x128) & auVar42._8_4_ | ~auVar42._8_4_ & (uint)fVar59;
              *(uint *)(local_188.ray + 300) =
                   *(uint *)(local_188.ray + 300) & auVar42._12_4_ | ~auVar42._12_4_ & (uint)fVar52;
              fVar55 = *(float *)(local_188.hit + 0x74);
              fVar59 = *(float *)(local_188.hit + 0x78);
              fVar52 = *(float *)(local_188.hit + 0x7c);
              *(uint *)(local_188.ray + 0x130) =
                   ~auVar42._0_4_ & (uint)*(float *)(local_188.hit + 0x70) |
                   *(uint *)(local_188.ray + 0x130) & auVar42._0_4_;
              *(uint *)(local_188.ray + 0x134) =
                   ~auVar42._4_4_ & (uint)fVar55 | *(uint *)(local_188.ray + 0x134) & auVar42._4_4_;
              *(uint *)(local_188.ray + 0x138) =
                   ~auVar42._8_4_ & (uint)fVar59 | *(uint *)(local_188.ray + 0x138) & auVar42._8_4_;
              *(uint *)(local_188.ray + 0x13c) =
                   ~auVar42._12_4_ & (uint)fVar52 |
                   *(uint *)(local_188.ray + 0x13c) & auVar42._12_4_;
              fVar55 = *(float *)(local_188.hit + 0x84);
              fVar59 = *(float *)(local_188.hit + 0x88);
              fVar52 = *(float *)(local_188.hit + 0x8c);
              *(uint *)(local_188.ray + 0x140) =
                   ~auVar42._0_4_ & (uint)*(float *)(local_188.hit + 0x80) |
                   *(uint *)(local_188.ray + 0x140) & auVar42._0_4_;
              *(uint *)(local_188.ray + 0x144) =
                   ~auVar42._4_4_ & (uint)fVar55 | *(uint *)(local_188.ray + 0x144) & auVar42._4_4_;
              *(uint *)(local_188.ray + 0x148) =
                   ~auVar42._8_4_ & (uint)fVar59 | *(uint *)(local_188.ray + 0x148) & auVar42._8_4_;
              *(uint *)(local_188.ray + 0x14c) =
                   ~auVar42._12_4_ & (uint)fVar52 |
                   *(uint *)(local_188.ray + 0x14c) & auVar42._12_4_;
              pRVar24 = (RayHitK<4> *)local_188.ray;
            }
          }
          auVar40._0_4_ = auVar38._0_4_ << 0x1f;
          auVar40._4_4_ = auVar38._4_4_ << 0x1f;
          auVar40._8_4_ = auVar38._8_4_ << 0x1f;
          auVar40._12_4_ = auVar38._12_4_ << 0x1f;
          iVar20 = movmskps((int)pRVar24,auVar40);
          uVar22 = CONCAT44((int)((ulong)pRVar24 >> 0x20),iVar20);
          if (iVar20 == 0) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_198;
          }
          local_1c8[lVar25] = 0;
          fVar55 = *(float *)(ray + k * 4 + 0x80);
          local_1c8[0] = -(uint)(auVar68._0_4_ <= fVar55) & local_1c8[0];
          local_1c8[1] = -(uint)(auVar68._4_4_ <= fVar55) & local_1c8[1];
          local_1c8[2] = -(uint)(auVar68._8_4_ <= fVar55) & local_1c8[2];
          local_1c8[3] = -(uint)(auVar68._12_4_ <= fVar55) & local_1c8[3];
        }
        auVar39._4_4_ = local_1c8[1];
        auVar39._0_4_ = local_1c8[0];
        auVar39._8_4_ = local_1c8[2];
        auVar39._12_4_ = local_1c8[3];
        iVar20 = movmskps((int)uVar22,auVar39);
        if (iVar20 == 0) {
          return;
        }
        auVar43._0_4_ = local_1c8[0] & auVar68._0_4_;
        auVar43._4_4_ = local_1c8[1] & auVar68._4_4_;
        auVar43._8_4_ = local_1c8[2] & auVar68._8_4_;
        auVar43._12_4_ = local_1c8[3] & auVar68._12_4_;
        auVar49._0_8_ = CONCAT44(~local_1c8[1],~local_1c8[0]) & 0x7f8000007f800000;
        auVar49._8_4_ = ~local_1c8[2] & 0x7f800000;
        auVar49._12_4_ = ~local_1c8[3] & 0x7f800000;
        auVar49 = auVar49 | auVar43;
        auVar50._4_4_ = auVar49._0_4_;
        auVar50._0_4_ = auVar49._4_4_;
        auVar50._8_4_ = auVar49._12_4_;
        auVar50._12_4_ = auVar49._8_4_;
        auVar47 = minps(auVar50,auVar49);
        auVar44._0_8_ = auVar47._8_8_;
        auVar44._8_4_ = auVar47._0_4_;
        auVar44._12_4_ = auVar47._4_4_;
        auVar47 = minps(auVar44,auVar47);
        auVar45._0_8_ =
             CONCAT44(-(uint)(auVar47._4_4_ == auVar49._4_4_) & local_1c8[1],
                      -(uint)(auVar47._0_4_ == auVar49._0_4_) & local_1c8[0]);
        auVar45._8_4_ = -(uint)(auVar47._8_4_ == auVar49._8_4_) & local_1c8[2];
        auVar45._12_4_ = -(uint)(auVar47._12_4_ == auVar49._12_4_) & local_1c8[3];
        iVar20 = movmskps(iVar20,auVar45);
        if (iVar20 != 0) {
          auVar39._8_4_ = auVar45._8_4_;
          auVar39._0_8_ = auVar45._0_8_;
          auVar39._12_4_ = auVar45._12_4_;
        }
        uVar21 = movmskps(iVar20,auVar39);
        uVar22 = CONCAT44((int)(uVar22 >> 0x20),uVar21);
        lVar25 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }